

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O2

int __thiscall
NULLCPugiXML::xml_attribute__set_valueS(NULLCPugiXML *this,NULLCArray rhs,xml_attribute *ptr)

{
  bool bVar1;
  undefined4 in_register_00000014;
  
  if (this == (NULLCPugiXML *)0x0) {
    this = (NULLCPugiXML *)0x1de627;
  }
  else if (((int)rhs.ptr == 0) || (this[(int)rhs.ptr - 1] != (NULLCPugiXML)0x0)) {
    bVar1 = false;
    nullcThrowError("string has to be null-terminated");
    goto LAB_00123d46;
  }
  bVar1 = pugi::xml_attribute::set_value
                    ((xml_attribute *)CONCAT44(in_register_00000014,rhs.len),(char_t *)this);
LAB_00123d46:
  return (int)bVar1;
}

Assistant:

int		xml_attribute__set_valueS(NULLCArray rhs, xml_attribute* ptr)
	{
		if(!rhs.ptr)
			return ptr->attribute.set_value("");

		if(!rhs.len || rhs.ptr[rhs.len - 1])
		{
			nullcThrowError("string has to be null-terminated");
			return 0;
		}

		return ptr->attribute.set_value(rhs.ptr);
	}